

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall
slang::parsing::Parser::parseModule
          (Parser *this,AttrList attributes,SyntaxKind parentKind,bool *anyLocalModules)

{
  ParserMetadata *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  SyntaxNode *pSVar5;
  value_type_pointer ppVar6;
  pointer puVar7;
  size_type sVar8;
  value_type_pointer pbVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined8 __n;
  bool bVar12;
  bool bVar13;
  TokenKind kind;
  SyntaxKind kind_00;
  int iVar14;
  AnonymousProgramSyntax *pAVar15;
  ModuleHeaderSyntax *pMVar16;
  Diagnostic *this_00;
  SourceLocation SVar17;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  ModuleDeclarationSyntax *pMVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong hash;
  TokenKind kind_01;
  long lVar22;
  ulong uVar23;
  size_type __rlen;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_01;
  byte bVar24;
  bool bVar25;
  uchar uVar26;
  uchar uVar28;
  uchar uVar29;
  undefined1 auVar27 [16];
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  undefined1 auVar30 [16];
  uchar uVar43;
  Token TVar44;
  SourceRange range;
  string_view arg;
  bool anyLocalModules_1;
  MemberSyntax *member;
  size_t pos;
  Token endmodule;
  string_view name;
  locator res;
  bool local_191;
  pointer local_190;
  Token *local_188;
  SyntaxKind local_17c;
  _Storage<slang::TimeScale,_true> local_178;
  bool local_174;
  MemberSyntax *local_170;
  uint64_t local_168;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_160;
  ModuleHeaderSyntax *local_158;
  Preprocessor *local_150;
  undefined1 local_148 [16];
  undefined8 local_138;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  uchar uStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  uchar uStack_129;
  ulong local_120;
  ulong local_118;
  group_type_pointer local_110;
  pointer local_108;
  size_t local_100;
  Token local_f8;
  undefined1 local_e8 [16];
  SyntaxNode *local_d8;
  SyntaxNode *pSStack_d0;
  pointer local_c0;
  undefined1 local_b0 [32];
  size_t local_90;
  pointer local_88;
  __extent_storage<18446744073709551615UL> local_80;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  bVar12 = ParserBase::peek(&this->super_ParserBase,ProgramKeyword);
  if ((bVar12) && (TVar44 = ParserBase::peek(&this->super_ParserBase,1), TVar44.kind == Semicolon))
  {
    pAVar15 = parseAnonymousProgram(this,attributes);
    return &pAVar15->super_MemberSyntax;
  }
  local_150 = (this->super_ParserBase).window.tokenSource;
  local_150->designElementDepth = local_150->designElementDepth + 1;
  local_108 = attributes._M_ptr;
  local_100 = attributes._M_extent._M_extent_value._M_extent_value;
  pMVar16 = parseModuleHeader(this);
  kind = syntax::SyntaxFacts::getModuleEndKind((pMVar16->moduleKeyword).kind);
  local_158 = pMVar16;
  if ((parentKind != CompilationUnit) &&
     (local_e8 = (undefined1  [16])Token::valueText(&pMVar16->name), local_e8._0_8_ != 0)) {
    if (*anyLocalModules == false) {
      SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::emplace_back<>(&(this->moduleDeclStack).
                        super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      );
      *anyLocalModules = true;
    }
    puVar7 = (this->moduleDeclStack).
             super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .data_;
    sVar8 = (this->moduleDeclStack).
            super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .len;
    local_190 = puVar7 + sVar8;
    this_01 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (puVar7 + (sVar8 - 1));
    local_168 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                          (this_01,(basic_string_view<char,_std::char_traits<char>_> *)local_e8);
    uVar23 = local_168 >> ((byte)*this_01 & 0x3f);
    local_110 = puVar7[sVar8 - 1].table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.groups_;
    lVar22 = (local_168 & 0xff) * 4;
    uVar26 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar22 + 0xc];
    uVar28 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar22 + 0xd];
    uVar29 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar22 + 0xe];
    uVar31 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar22 + 0xf];
    __n = local_e8._0_8_;
    local_188 = (Token *)local_e8._8_8_;
    local_118 = (ulong)((uint)local_168 & 7);
    uVar19 = 0;
    uVar32 = uVar26;
    uVar33 = uVar28;
    uVar34 = uVar29;
    uVar35 = uVar31;
    uVar36 = uVar26;
    uVar37 = uVar28;
    uVar38 = uVar29;
    uVar39 = uVar31;
    uVar40 = uVar26;
    uVar41 = uVar28;
    uVar42 = uVar29;
    uVar43 = uVar31;
    local_160 = this_01;
    local_120 = uVar23;
    do {
      local_148._0_8_ = uVar23;
      pgVar3 = local_110 + uVar23;
      local_48 = pgVar3->m[0].n;
      uStack_47 = pgVar3->m[1].n;
      uStack_46 = pgVar3->m[2].n;
      uStack_45 = pgVar3->m[3].n;
      uStack_44 = pgVar3->m[4].n;
      uStack_43 = pgVar3->m[5].n;
      uStack_42 = pgVar3->m[6].n;
      uStack_41 = pgVar3->m[7].n;
      uStack_40 = pgVar3->m[8].n;
      uStack_3f = pgVar3->m[9].n;
      uStack_3e = pgVar3->m[10].n;
      uStack_3d = pgVar3->m[0xb].n;
      uStack_3c = pgVar3->m[0xc].n;
      uStack_3b = pgVar3->m[0xd].n;
      uStack_3a = pgVar3->m[0xe].n;
      uStack_39 = pgVar3->m[0xf].n;
      auVar27[0] = -(local_48 == uVar26);
      auVar27[1] = -(uStack_47 == uVar28);
      auVar27[2] = -(uStack_46 == uVar29);
      auVar27[3] = -(uStack_45 == uVar31);
      auVar27[4] = -(uStack_44 == uVar32);
      auVar27[5] = -(uStack_43 == uVar33);
      auVar27[6] = -(uStack_42 == uVar34);
      auVar27[7] = -(uStack_41 == uVar35);
      auVar27[8] = -(uStack_40 == uVar36);
      auVar27[9] = -(uStack_3f == uVar37);
      auVar27[10] = -(uStack_3e == uVar38);
      auVar27[0xb] = -(uStack_3d == uVar39);
      auVar27[0xc] = -(uStack_3c == uVar40);
      auVar27[0xd] = -(uStack_3b == uVar41);
      auVar27[0xe] = -(uStack_3a == uVar42);
      auVar27[0xf] = -(uStack_39 == uVar43);
      local_17c = CONCAT31(local_17c._1_3_,uStack_39);
      uVar20 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
      if (uVar20 != 0) {
        pbVar9 = local_190[-1].table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.elements_;
        local_138 = (Token *)CONCAT17(uVar35,CONCAT16(uVar34,CONCAT15(uVar33,CONCAT14(uVar32,
                                                  CONCAT13(uVar31,CONCAT12(uVar29,CONCAT11(uVar28,
                                                  uVar26)))))));
        uStack_130 = uVar36;
        uStack_12f = uVar37;
        uStack_12e = uVar38;
        uStack_12d = uVar39;
        uStack_12c = uVar40;
        uStack_12b = uVar41;
        uStack_12a = uVar42;
        uStack_129 = uVar43;
        do {
          iVar14 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
            }
          }
          if ((SyntaxNode *)__n ==
              *(SyntaxNode **)((long)&pbVar9[uVar23 * 0xf]._M_len + (ulong)(uint)(iVar14 << 4))) {
            if ((SyntaxNode *)__n == (SyntaxNode *)0x0) goto LAB_001d4d0c;
            iVar14 = bcmp(local_188,
                          *(void **)((long)&pbVar9[uVar23 * 0xf]._M_str + (ulong)(uint)(iVar14 << 4)
                                    ),__n);
            uVar26 = (uchar)local_138;
            uVar28 = local_138._1_1_;
            uVar29 = local_138._2_1_;
            uVar31 = local_138._3_1_;
            uVar32 = local_138._4_1_;
            uVar33 = local_138._5_1_;
            uVar34 = local_138._6_1_;
            uVar35 = local_138._7_1_;
            uVar36 = uStack_130;
            uVar37 = uStack_12f;
            uVar38 = uStack_12e;
            uVar39 = uStack_12d;
            uVar40 = uStack_12c;
            uVar41 = uStack_12b;
            uVar42 = uStack_12a;
            uVar43 = uStack_129;
            if (iVar14 == 0) goto LAB_001d4d0c;
          }
          uVar20 = uVar20 - 1 & uVar20;
        } while (uVar20 != 0);
      }
      puVar7 = local_190;
      if ((*(byte *)((long)&boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::plain_integral>::
                            is_not_overflowed(unsigned_long)::shift + local_118) &
          (undefined1)local_17c) == 0) break;
      uVar21 = local_190[-1].table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_size_mask;
      lVar22 = local_148._0_8_ + uVar19;
      uVar19 = uVar19 + 1;
      uVar23 = lVar22 + 1U & uVar21;
    } while (uVar19 <= uVar21);
    if (local_190[-1].table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        local_190[-1].table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)local_b0,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)local_160,(arrays_type *)local_160,local_120,local_168,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_e8);
      psVar1 = &puVar7[-1].table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)local_b0,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)local_160,local_168,(basic_string_view<char,_std::char_traits<char>_> *)local_e8
                );
    }
  }
LAB_001d4d0c:
  kind_00 = syntax::SyntaxFacts::getModuleDeclarationKind((local_158->moduleKeyword).kind);
  uVar20._0_2_ = local_150->defaultNetType;
  uVar20._2_2_ = local_150->unconnectedDrive;
  local_148 = ZEXT416(uVar20);
  local_190 = (pointer)CONCAT71(local_190._1_7_,local_150->cellDefine);
  local_174 = (local_150->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged;
  local_178 = (local_150->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_17c = this->currentDefinitionKind;
  this->currentDefinitionKind = kind_00;
  Token::Token(&local_f8);
  local_b0._0_8_ = local_b0 + 0x18;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = (SyntaxNode *)0x8;
  local_191 = false;
  local_188 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_138 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar12 = false;
  while( true ) {
    TVar44 = ParserBase::peek(&this->super_ParserBase);
    kind_01 = TVar44.kind;
    if ((kind_01 == EndOfFile) || (kind == kind_01)) break;
    local_170 = parseMember(this,kind_00,&local_191);
    bVar25 = local_170 == (MemberSyntax *)0x0;
    if (bVar25) {
      bVar13 = syntax::SyntaxFacts::isCloseDelimOrKeyword(kind_01);
      if (bVar13) {
        local_e8 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        range = Token::range((Token *)local_e8);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_e8 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText((Token *)local_e8);
        Diagnostic::operator<<(this_00,arg);
        bVar24 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar24 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar17 = Token::location(local_188);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar17);
          SVar17 = Token::location(local_138);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar17);
          bVar24 = 0;
        }
      }
      else {
        bVar24 = ~bVar12 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar24 << 0x20 | 0x450005));
      bVar12 = bVar25;
    }
    else {
      checkMemberAllowed(this,&local_170->super_SyntaxNode,kind_00);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)local_b0,&local_170);
      pSVar5 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (local_170->super_SyntaxNode).previewNode = pSVar5;
      bVar12 = bVar25;
    }
  }
  if (local_191 == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  local_f8 = ParserBase::expect(&this->super_ParserBase,kind);
  iVar14 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                     ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)local_b0,
                      (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_f8.info);
  local_188 = (Token *)CONCAT44(extraout_var,iVar14);
  if ((group15<boost::unordered::detail::foa::plain_integral> *)local_b0._0_8_ !=
      (group15<boost::unordered::detail::foa::plain_integral> *)(local_b0 + 0x18)) {
    operator_delete((void *)local_b0._0_8_);
  }
  this->currentDefinitionKind = local_17c;
  local_150->designElementDepth = local_150->designElementDepth + -1;
  endBlock = parseNamedBlockClause(this);
  pMVar16 = local_158;
  TVar44.kind = (local_158->name).kind;
  TVar44._2_1_ = (local_158->name).field_0x2;
  TVar44.numFlags.raw = (local_158->name).numFlags.raw;
  TVar44.rawLen = (local_158->name).rawLen;
  TVar44.info = (local_158->name).info;
  checkBlockNames(this,TVar44,endBlock);
  local_b0._8_4_ = 1;
  local_b0._16_8_ = (SyntaxNode *)0x0;
  local_b0[0x18] = '\0';
  local_b0[0x19] = '\0';
  local_b0[0x1a] = '\0';
  local_b0[0x1b] = '\0';
  local_b0[0x1c] = '\0';
  local_b0[0x1d] = '\0';
  local_b0[0x1e] = '\0';
  local_b0[0x1f] = '\0';
  local_90 = local_100;
  local_88 = local_108;
  local_80._M_extent_value = local_100;
  local_b0._0_8_ = &PTR_getChild_002f75e8;
  local_e8._8_4_ = 1;
  local_d8 = (SyntaxNode *)0x0;
  pSStack_d0 = (SyntaxNode *)0x0;
  local_c0 = (pointer)local_188;
  local_e8._0_8_ = &PTR_getChild_002f76d8;
  pMVar18 = syntax::SyntaxFactory::moduleDeclaration
                      (&this->factory,kind_00,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_b0,pMVar16,
                       (SyntaxList<slang::syntax::MemberSyntax> *)local_e8,local_f8,endBlock);
  arrays_ = &this->meta;
  local_e8._0_8_ = pMVar18;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = pMVar18;
  hash = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar19 = hash >> ((byte)(this->meta).nodeMap.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                          .arrays.groups_size_index & 0x3f);
  uVar4 = *(undefined4 *)
           (boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word + (hash & 0xff) * 4);
  ppVar6 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.elements_;
  local_188 = (Token *)(this->meta).nodeMap.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                       .arrays.groups_size_mask;
  uVar21 = 0;
  uVar23 = uVar19;
  do {
    pgVar2 = (this->meta).nodeMap.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
             .arrays.groups_ + uVar23;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bStack_49 = pgVar2->m[0xf].n;
    uVar26 = (uchar)uVar4;
    auVar30[0] = -(local_58 == uVar26);
    uVar28 = (uchar)((uint)uVar4 >> 8);
    auVar30[1] = -(uStack_57 == uVar28);
    uVar29 = (uchar)((uint)uVar4 >> 0x10);
    auVar30[2] = -(uStack_56 == uVar29);
    bVar24 = (byte)((uint)uVar4 >> 0x18);
    auVar30[3] = -(bStack_55 == bVar24);
    auVar30[4] = -(uStack_54 == uVar26);
    auVar30[5] = -(uStack_53 == uVar28);
    auVar30[6] = -(uStack_52 == uVar29);
    auVar30[7] = -(bStack_51 == bVar24);
    auVar30[8] = -(uStack_50 == uVar26);
    auVar30[9] = -(uStack_4f == uVar28);
    auVar30[10] = -(uStack_4e == uVar29);
    auVar30[0xb] = -(bStack_4d == bVar24);
    auVar30[0xc] = -(uStack_4c == uVar26);
    auVar30[0xd] = -(uStack_4b == uVar28);
    auVar30[0xe] = -(uStack_4a == uVar29);
    auVar30[0xf] = -(bStack_49 == bVar24);
    for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe); uVar20 != 0;
        uVar20 = uVar20 - 1 & uVar20) {
      uVar10 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if (pMVar18 == (ModuleDeclarationSyntax *)ppVar6[uVar23 * 0xf + (ulong)uVar10].first) {
        local_b0._16_8_ = ppVar6 + uVar23 * 0xf + (ulong)uVar10;
        goto LAB_001d5175;
      }
    }
    if ((*(byte *)((long)&boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::
                          is_not_overflowed(unsigned_long)::shift + (ulong)((uint)hash & 7)) &
        bStack_49) == 0) break;
    lVar22 = uVar23 + uVar21;
    uVar21 = uVar21 + 1;
    uVar23 = lVar22 + 1U & (ulong)local_188;
  } while (uVar21 <= local_188);
  if ((this->meta).nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .size_ctrl.size <
      (this->meta).nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              ((locator *)local_b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                *)arrays_,(arrays_type *)arrays_,uVar19,hash,(try_emplace_args_t *)&local_170,
               (SyntaxNode **)local_e8);
    psVar1 = &(this->meta).nodeMap.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              ((locator *)local_b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                *)arrays_,hash,(try_emplace_args_t *)&local_170,(SyntaxNode **)local_e8);
  }
LAB_001d5175:
  *(TokenKind *)&((SyntaxNode *)local_b0._16_8_)->parent = local_148._0_2_;
  *(undefined2 *)((long)&((SyntaxNode *)local_b0._16_8_)->parent + 2) = local_148._2_2_;
  ((Node *)&((SyntaxNode *)local_b0._16_8_)->parent)->cellDefine = local_190._0_1_;
  (((Node *)&((SyntaxNode *)local_b0._16_8_)->parent)->timeScale).
  super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = local_178;
  *(bool *)((long)&((SyntaxNode *)local_b0._16_8_)->previewNode + 1) = local_174;
  return &pMVar18->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseModule(AttrList attributes, SyntaxKind parentKind,
                                  bool& anyLocalModules) {
    if (peek(TokenKind::ProgramKeyword) && peek(1).kind == TokenKind::Semicolon)
        return parseAnonymousProgram(attributes);

    // Tell the preprocessor that we're inside a design element for the duration of this function.
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto& header = parseModuleHeader();
    auto endKind = getModuleEndKind(header.moduleKeyword.kind);

    // If the parent isn't a compilation unit, that means we're a nested definition.
    // Record our name in the decl stack so that child instantiations know they're
    // referencing a local module and not a global one.
    if (parentKind != SyntaxKind::CompilationUnit) {
        auto name = header.name.valueText();
        if (!name.empty()) {
            if (!anyLocalModules) {
                moduleDeclStack.emplace_back();
                anyLocalModules = true;
            }
            moduleDeclStack.back().emplace(name);
        }
    }

    SyntaxKind declKind = getModuleDeclarationKind(header.moduleKeyword.kind);
    ParserMetadata::Node node{pp.getDefaultNetType(), pp.getUnconnectedDrive(), pp.getCellDefine(),
                              pp.getTimeScale()};

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = declKind;

    Token endmodule;
    auto members = parseMemberList<MemberSyntax>(
        endKind, endmodule, declKind, [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;
    pp.popDesignElementStack();

    auto endName = parseNamedBlockClause();
    checkBlockNames(header.name, endName);

    auto& result = factory.moduleDeclaration(declKind, attributes, header, members, endmodule,
                                             endName);

    meta.nodeMap[&result] = node;
    return result;
}